

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_choice.cpp
# Opt level: O0

Am_Object choice_set_impl_command(Am_Object *inter,Am_Object *param_2,Am_Inter_Location *param_3)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value *local_a8;
  Am_Value *local_90;
  undefined1 local_58 [8];
  Am_Value value;
  Am_Object local_38;
  undefined1 local_29;
  Am_Inter_Location *param_2_local;
  Am_Object *param_1_local;
  Am_Object *inter_local;
  Am_Object *impl_command;
  
  local_29 = 0;
  param_2_local = param_3;
  param_1_local = param_2;
  inter_local = inter;
  Am_Object::Am_Object(inter);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)param_2,0xc6);
  Am_Object::operator=(inter,&local_38);
  Am_Object::~Am_Object(&local_38);
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)local_58);
    pAVar2 = Am_Object::Peek(param_2,0x169,0);
    Am_Value::operator=((Am_Value *)local_58,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_58);
    if (bVar1) {
      local_90 = (Am_Value *)local_58;
    }
    else {
      local_90 = &Am_No_Value;
    }
    Am_Object::Set(inter,0x169,local_90,1);
    Am_Object::Set(inter,0x16d,(Am_Value *)local_58,0);
    pAVar2 = Am_Object::Peek(param_2,0x16c,0);
    Am_Value::operator=((Am_Value *)local_58,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_58);
    if (bVar1) {
      local_a8 = (Am_Value *)local_58;
    }
    else {
      local_a8 = &Am_No_Value;
    }
    Am_Object::Set(inter,0x16c,local_a8,1);
    Am_Value::~Am_Value((Am_Value *)local_58);
  }
  return (Am_Object)(Am_Object_Data *)inter;
}

Assistant:

Am_Object
choice_set_impl_command(Am_Object inter, Am_Object /* object_modified */,
                        Am_Inter_Location /* data */)
{
  Am_Object impl_command;
  impl_command = inter.Get_Object(Am_IMPLEMENTATION_COMMAND);
  if (impl_command.Valid()) {

    //set current value into the Am_VALUE slot
    Am_Value value;
    value = inter.Peek(Am_VALUE);
    impl_command.Set(Am_VALUE, value.Exists() ? value : Am_No_Value,
                     Am_OK_IF_NOT_THERE);

    impl_command.Set(Am_OBJECT_MODIFIED, value);

    //set original data into the OLD_VALUE slot
    value = inter.Peek(Am_OLD_VALUE);
    impl_command.Set(Am_OLD_VALUE, value.Exists() ? value : Am_No_Value,
                     Am_OK_IF_NOT_THERE);
  }
  return impl_command;
}